

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_image * nk_subimage_handle(nk_handle handle,unsigned_short w,unsigned_short h,nk_rect r)

{
  unsigned_short in_CX;
  unsigned_short in_DX;
  nk_handle in_RSI;
  nk_image *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  nk_image *s;
  nk_size in_stack_ffffffffffffffc8;
  nk_image *pnVar1;
  float local_18;
  float fStack_14;
  float local_10;
  float fStack_c;
  
  pnVar1 = in_RDI;
  nk_zero(in_RDI,in_stack_ffffffffffffffc8);
  pnVar1->handle = in_RSI;
  pnVar1->w = in_DX;
  pnVar1->h = in_CX;
  local_18 = (float)in_XMM0_Qa;
  pnVar1->region[0] = (unsigned_short)(int)local_18;
  fStack_14 = (float)((ulong)in_XMM0_Qa >> 0x20);
  pnVar1->region[1] = (unsigned_short)(int)fStack_14;
  local_10 = (float)in_XMM1_Qa;
  pnVar1->region[2] = (unsigned_short)(int)local_10;
  fStack_c = (float)((ulong)in_XMM1_Qa >> 0x20);
  pnVar1->region[3] = (unsigned_short)(int)fStack_c;
  return in_RDI;
}

Assistant:

NK_API struct nk_image
nk_subimage_handle(nk_handle handle, unsigned short w, unsigned short h,
struct nk_rect r)
{
struct nk_image s;
nk_zero(&s, sizeof(s));
s.handle = handle;
s.w = w; s.h = h;
s.region[0] = (unsigned short)r.x;
s.region[1] = (unsigned short)r.y;
s.region[2] = (unsigned short)r.w;
s.region[3] = (unsigned short)r.h;
return s;
}